

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_xattrs(archive_write_disk *a)

{
  int iVar1;
  char *__path;
  int *piVar2;
  wchar_t wVar3;
  int local_5c;
  size_t sStack_58;
  wchar_t e;
  size_t size;
  void *value;
  char *name;
  wchar_t local_38;
  wchar_t wStack_34;
  short fail;
  wchar_t i;
  wchar_t ret;
  archive_string errlist;
  archive_entry *entry;
  archive_write_disk *a_local;
  
  errlist.buffer_length = (size_t)a->entry;
  wStack_34 = L'\0';
  local_38 = archive_entry_xattr_reset((archive_entry *)errlist.buffer_length);
  name._6_2_ = 0;
  _i = (char *)0x0;
  errlist.s = (char *)0x0;
  errlist.length = 0;
  while (wVar3 = local_38 + L'\xffffffff', local_38 != L'\0') {
    local_38 = wVar3;
    archive_entry_xattr_next
              ((archive_entry *)errlist.buffer_length,(char **)&value,(void **)&size,
               &stack0xffffffffffffffa8);
    if (((value != (void *)0x0) &&
        ((iVar1 = strncmp((char *)value,"system.",7), iVar1 != 0 ||
         ((iVar1 = strcmp((char *)((long)value + 7),"posix_acl_access"), iVar1 != 0 &&
          (iVar1 = strcmp((char *)((long)value + 7),"posix_acl_default"), iVar1 != 0)))))) &&
       ((iVar1 = strncmp((char *)value,"trusted.SGI_",0xc), iVar1 != 0 ||
        ((iVar1 = strcmp((char *)((long)value + 0xc),"ACL_DEFAULT"), iVar1 != 0 &&
         (iVar1 = strcmp((char *)((long)value + 0xc),"ACL_FILE"), iVar1 != 0)))))) {
      iVar1 = strncmp((char *)value,"xfsroot.",8);
      if (iVar1 == 0) {
        name._6_2_ = 1;
        archive_strcat((archive_string *)&i,value);
        archive_strappend_char((archive_string *)&i,' ');
      }
      else {
        if (a->fd < L'\0') {
          __path = archive_entry_pathname((archive_entry *)errlist.buffer_length);
          local_5c = lsetxattr(__path,(char *)value,(void *)size,sStack_58,0);
        }
        else {
          local_5c = fsetxattr(a->fd,(char *)value,(void *)size,sStack_58,0);
        }
        if (local_5c == -1) {
          wStack_34 = L'\xffffffec';
          archive_strcat((archive_string *)&i,value);
          archive_strappend_char((archive_string *)&i,' ');
          piVar2 = __errno_location();
          if ((*piVar2 != 0x5f) && (piVar2 = __errno_location(), *piVar2 != 0x26)) {
            name._6_2_ = 1;
          }
        }
      }
    }
  }
  local_38 = wVar3;
  if (wStack_34 == L'\xffffffec') {
    if ((name._6_2_ == 0) || (errlist.s == (char *)0x0)) {
      archive_set_error(&a->archive,-1,"Cannot restore extended attributes on this file system.");
    }
    else {
      errlist.s = errlist.s + -1;
      _i[(long)errlist.s] = '\0';
      archive_set_error(&a->archive,-1,"Cannot restore extended attributes: %s",_i);
    }
  }
  archive_string_free((archive_string *)&i);
  return wStack_34;
}

Assistant:

static int
set_xattrs(struct archive_write_disk *a)
{
	struct archive_entry *entry = a->entry;
	struct archive_string errlist;
	int ret = ARCHIVE_OK;
	int i = archive_entry_xattr_reset(entry);
	short fail = 0;

	archive_string_init(&errlist);

	while (i--) {
		const char *name;
		const void *value;
		size_t size;
		int e;

		archive_entry_xattr_next(entry, &name, &value, &size);

		if (name == NULL)
			continue;
#if ARCHIVE_XATTR_LINUX
		/* Linux: quietly skip POSIX.1e ACL extended attributes */
		if (strncmp(name, "system.", 7) == 0 &&
		   (strcmp(name + 7, "posix_acl_access") == 0 ||
		    strcmp(name + 7, "posix_acl_default") == 0))
			continue;
		if (strncmp(name, "trusted.SGI_", 12) == 0 &&
		   (strcmp(name + 12, "ACL_DEFAULT") == 0 ||
		    strcmp(name + 12, "ACL_FILE") == 0))
			continue;

		/* Linux: xfsroot namespace is obsolete and unsupported */
		if (strncmp(name, "xfsroot.", 8) == 0) {
			fail = 1;
			archive_strcat(&errlist, name);
			archive_strappend_char(&errlist, ' ');
			continue;
		}
#endif

		if (a->fd >= 0) {
#if ARCHIVE_XATTR_LINUX
			e = fsetxattr(a->fd, name, value, size, 0);
#elif ARCHIVE_XATTR_DARWIN
			e = fsetxattr(a->fd, name, value, size, 0, 0);
#elif ARCHIVE_XATTR_AIX
			e = fsetea(a->fd, name, value, size, 0);
#endif
		} else {
#if ARCHIVE_XATTR_LINUX
			e = lsetxattr(archive_entry_pathname(entry),
			    name, value, size, 0);
#elif ARCHIVE_XATTR_DARWIN
			e = setxattr(archive_entry_pathname(entry),
			    name, value, size, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
			e = lsetea(archive_entry_pathname(entry),
			    name, value, size, 0);
#endif
		}
		if (e == -1) {
			ret = ARCHIVE_WARN;
			archive_strcat(&errlist, name);
			archive_strappend_char(&errlist, ' ');
			if (errno != ENOTSUP && errno != ENOSYS)
				fail = 1;
		}
	}

	if (ret == ARCHIVE_WARN) {
		if (fail && errlist.length > 0) {
			errlist.length--;
			errlist.s[errlist.length] = '\0';
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Cannot restore extended attributes: %s",
			    errlist.s);
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Cannot restore extended "
			    "attributes on this file system.");
	}

	archive_string_free(&errlist);
	return (ret);
}